

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

void libtorrent::aux::escape_string(string *ret,char *str,int len)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  char tmp [3];
  char local_33 [3];
  
  uVar5 = (ulong)len;
  pcVar1 = str + uVar5;
  pcVar2 = str;
  if (0 < (long)uVar5 >> 2) {
    pcVar2 = str + (uVar5 & 0xfffffffffffffffc);
    lVar4 = ((long)uVar5 >> 2) + 1;
    pcVar3 = str + 3;
    do {
      if ((byte)(pcVar3[-3] + 0x81U) < 0xa1) {
        pcVar3 = pcVar3 + -3;
        goto LAB_00186218;
      }
      if ((byte)(pcVar3[-2] + 0x81U) < 0xa1) {
        pcVar3 = pcVar3 + -2;
        goto LAB_00186218;
      }
      if ((byte)(pcVar3[-1] + 0x81U) < 0xa1) {
        pcVar3 = pcVar3 + -1;
        goto LAB_00186218;
      }
      if ((byte)(*pcVar3 + 0x81U) < 0xa1) goto LAB_00186218;
      lVar4 = lVar4 + -1;
      pcVar3 = pcVar3 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)pcVar1 - (long)pcVar2;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pcVar3 = pcVar1;
      if ((lVar4 != 3) || (pcVar3 = pcVar2, (byte)(*pcVar2 + 0x81U) < 0xa1)) goto LAB_00186218;
      pcVar2 = pcVar2 + 1;
    }
    pcVar3 = pcVar2;
    if ((byte)(*pcVar2 + 0x81U) < 0xa1) goto LAB_00186218;
    pcVar2 = pcVar2 + 1;
  }
  pcVar3 = pcVar2;
  if (0xa0 < (byte)(*pcVar2 + 0x81U)) {
    pcVar3 = pcVar1;
  }
LAB_00186218:
  if (pcVar3 == pcVar1) {
    ::std::__cxx11::string::_M_replace((ulong)ret,0,(char *)ret->_M_string_length,(ulong)str);
    return;
  }
  if (0 < len) {
    uVar5 = 0;
    do {
      snprintf(local_33,3,"%02x",(ulong)(byte)str[uVar5]);
      ::std::__cxx11::string::append((char *)ret);
      uVar5 = uVar5 + 1;
    } while ((uint)len != uVar5);
  }
  return;
}

Assistant:

void escape_string(std::string& ret, char const* str, int len)
	{
		if (std::any_of(str, str + len, [](char const c) { return c < 32 || c >= 127; } ))
		{
			for (int i = 0; i < len; ++i)
			{
				char tmp[3];
				std::snprintf(tmp, sizeof(tmp), "%02x", std::uint8_t(str[i]));
				ret += tmp;
			}
		}
		else
		{
			ret.assign(str, std::size_t(len));
		}
	}